

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgp.cpp
# Opt level: O2

bool bgp_update(bgp_peer *peer,uchar *buff,int entire_length)

{
  uint32_t *puVar1;
  byte bVar2;
  uint uVar3;
  uint8_t prefix_len_00;
  bgp_peer *my_peer;
  ushort unfeasible_routes_length;
  ushort total_path_attribute_length;
  node<adj_ribs_in_data> *pnVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  adj_ribs_in_data *paVar8;
  undefined8 *puVar9;
  uint32_t prefix;
  byte bVar10;
  adj_ribs_in_data in_stack_fffffffffffffd78;
  int prefix_len;
  int local_164;
  bool is_updated;
  uchar *local_158;
  bgp_peer *local_150;
  adj_ribs_in_data route_data;
  
  bVar10 = 0;
  unfeasible_routes_length = *(ushort *)(buff + 0x13) << 8 | *(ushort *)(buff + 0x13) >> 8;
  local_164 = entire_length;
  local_150 = peer;
  bgp_update_handle_unfeasible_prefix(peer,buff,unfeasible_routes_length);
  route_data.path_attr.origin = '\0';
  route_data.path_attr.as_path_length = '\0';
  memset(route_data.path_attr.as_path,0,0x114);
  total_path_attribute_length =
       *(ushort *)(buff + (ulong)unfeasible_routes_length + 0x15) << 8 |
       *(ushort *)(buff + (ulong)unfeasible_routes_length + 0x15) >> 8;
  bgp_update_handle_path_attribute
            (peer,buff,unfeasible_routes_length,total_path_attribute_length,&route_data);
  uVar7 = (uint)unfeasible_routes_length + (uint)total_path_attribute_length + 0x17;
  local_158 = buff;
  do {
    iVar6 = 4;
    if (local_164 <= (int)uVar7) {
      return true;
    }
    bVar2 = local_158[uVar7];
    prefix_len = (int)bVar2;
    if ((uint)prefix_len < 9) {
      prefix = (uint)local_158[(ulong)uVar7 + 1] << 0x18;
      iVar6 = 2;
    }
    else if (bVar2 < 0x11) {
      prefix = (uint)local_158[(ulong)uVar7 + 2] << 0x10 | (uint)local_158[(ulong)uVar7 + 1] << 0x18
      ;
      iVar6 = 3;
    }
    else if (bVar2 < 0x19) {
      prefix = (uint)local_158[(ulong)uVar7 + 3] << 8 |
               (uint)local_158[(ulong)uVar7 + 2] << 0x10 | (uint)local_158[(ulong)uVar7 + 1] << 0x18
      ;
    }
    else {
      if (0x20 < bVar2) {
        log<>(ERROR,"Invalid packet");
        return true;
      }
      uVar3 = *(uint *)(local_158 + (ulong)uVar7 + 1);
      prefix = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      iVar6 = 5;
    }
    _is_updated = inet_ntoa((in_addr)(prefix >> 0x18 | (prefix & 0xff0000) >> 8 |
                                      (prefix & 0xff00) << 8 | prefix << 0x18));
    log<char*,int>(DEBUG,"%s/%d",(char **)&is_updated,&prefix_len);
    my_peer = local_150;
    pnVar4 = local_150->adj_ribs_in;
    prefix_len_00 = (uint8_t)prefix_len;
    paVar8 = &route_data;
    puVar9 = (undefined8 *)&stack0xfffffffffffffd78;
    for (lVar5 = 0x23; lVar5 != 0; lVar5 = lVar5 + -1) {
      *puVar9 = *(undefined8 *)&paVar8->path_attr;
      paVar8 = (adj_ribs_in_data *)((long)paVar8 + (ulong)bVar10 * -0x10 + 8);
      puVar9 = puVar9 + (ulong)bVar10 * -2 + 1;
    }
    pnVar4 = add_prefix<adj_ribs_in_data>
                       (pnVar4,prefix,prefix_len_00,in_stack_fffffffffffffd78,&is_updated);
    if (is_updated == false) {
      puVar1 = &my_peer->route_count;
      *puVar1 = *puVar1 + 1;
    }
    else {
      log<>(DEBUG,"Route updated!");
    }
    uVar7 = uVar7 + iVar6;
    attempt_to_install_bgp_loc_rib(my_peer,pnVar4);
  } while( true );
}

Assistant:

bool bgp_update(bgp_peer* peer,  unsigned char* buff, int entire_length){
    uint16_t unfeasible_routes_length;
    memcpy(&unfeasible_routes_length, &buff[19], 2);
    unfeasible_routes_length = ntohs(unfeasible_routes_length);
    int read_length;

    bgp_update_handle_unfeasible_prefix(peer, buff, unfeasible_routes_length);

    adj_ribs_in_data route_data;
    uint16_t total_path_attribute_length;
    memcpy(&total_path_attribute_length, &buff[19 + 2 + unfeasible_routes_length], 2);
    total_path_attribute_length = ntohs(total_path_attribute_length);

    bgp_update_handle_path_attribute(peer, buff, unfeasible_routes_length, total_path_attribute_length, route_data);

    read_length = 19 + 2 + unfeasible_routes_length + 2 + total_path_attribute_length;

    while(read_length < entire_length){
        uint32_t prefix;
        int prefix_len = buff[read_length];
        if(prefix_len <= 8){
            prefix = buff[read_length + 1]*256*256*256;
            read_length += 2;
        }else if(prefix_len <= 16){
            prefix = buff[read_length + 1]*256*256*256 + buff[read_length + 2]*256*256;
            read_length += 3;
        }else if(prefix_len <= 24){
            prefix = buff[read_length + 1]*256*256*256 + buff[read_length + 2]*256*256 + buff[read_length + 3]*256;
            read_length += 4;
        }else if(prefix_len <= 32){
            prefix = buff[read_length + 1]*256*256*256 + buff[read_length + 2]*256*256 + buff[read_length + 3]*256 + buff[read_length + 4];
            read_length += 5;
        }else{
            log(log_level::ERROR, "Invalid packet");
            break;
        }
        log(log_level::DEBUG, "%s/%d", inet_ntoa(in_addr{.s_addr=ntohl(prefix)}), prefix_len);
        bool is_updated;
        node<adj_ribs_in_data>* added = add_prefix(peer->adj_ribs_in, prefix, prefix_len, route_data, &is_updated);
        if(!is_updated){
            peer->route_count++;
        }else{
            log(log_level::DEBUG, "Route updated!");
        }
        attempt_to_install_bgp_loc_rib(peer, added);
    }
    return true;
}